

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void hd_drop_context(hd_context *ctx)

{
  if (ctx != (hd_context *)0x0) {
    hd_drop_disk_handler_context(ctx);
    hd_drop_part_handler_context(ctx);
    hd_drop_pthread_context(ctx);
    if (ctx->warn != (hd_warn_context *)0x0) {
      hd_flush_warnings(ctx);
      hd_free(ctx,ctx->warn);
    }
    if (ctx->error != (hd_error_context *)0x0) {
      hd_free(ctx,ctx->error);
    }
    (*ctx->alloc->free)(ctx->alloc->user,ctx);
    return;
  }
  return;
}

Assistant:

void
hd_drop_context(hd_context *ctx)
{
    if (!ctx)
        return;

    /* Other finalisation calls go here (in reverse order) */
    hd_drop_disk_handler_context(ctx);
    hd_drop_part_handler_context(ctx);
    hd_drop_pthread_context(ctx);

    if (ctx->warn)
    {
        hd_flush_warnings(ctx);
        hd_free(ctx, ctx->warn);
    }

    if (ctx->error)
    {
        //assert(ctx->error->top == ctx->error->stack - 1);
        hd_free(ctx, ctx->error);
    }

    /* Free the context itself */
    ctx->alloc->free(ctx->alloc->user, ctx);
}